

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,int *active,char *str,int len,
                nk_toggle_type type,nk_style_toggle *style,nk_input *in,nk_user_font *font)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  nk_image *img;
  uint uVar4;
  nk_style_item *pnVar5;
  nk_style_toggle *pnVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect r_02;
  nk_rect r_03;
  nk_rect r_04;
  nk_rect r_05;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_06;
  nk_rect rect_01;
  nk_rect b;
  undefined8 local_128;
  nk_text local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  char *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  undefined4 uStack_84;
  float fStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  
  fVar12 = r.x;
  fStack_e4 = r.y;
  if (style == (nk_style_toggle *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4ff7,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4ff8,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4ff9,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (active == (int *)0x0) goto LAB_00121993;
  fVar14 = font->height;
  fVar8 = (style->padding).x;
  local_f8 = (style->padding).y;
  fVar13 = fVar8 + fVar8 + fVar14;
  if (fVar13 <= r.w) {
    fVar13 = r.w;
  }
  local_78 = ZEXT416((uint)local_f8);
  local_f8 = local_f8 + local_f8;
  fVar7 = local_f8 + fVar14;
  if (local_f8 + fVar14 <= r.h) {
    fVar7 = r.h;
  }
  fVar10 = (style->touch_padding).x;
  local_48 = fVar12 - fVar10;
  fVar9 = (style->touch_padding).y;
  local_98 = fStack_e4 - fVar9;
  fVar11 = fVar10 + fVar10 + fVar13;
  fVar10 = fVar9 + fVar9 + fVar7;
  local_c8 = ZEXT416((uint)((fVar7 * 0.5 + fStack_e4) - fVar14 * 0.5));
  local_88 = style->border;
  fVar7 = local_88 + local_88;
  _local_a8 = ZEXT416((uint)fVar14);
  local_e8 = fVar12 + fVar14 + style->spacing;
  local_b8._8_4_ = in_XMM0_Dc;
  local_b8._0_8_ = r._0_8_;
  local_b8._12_4_ = in_XMM0_Dd;
  uVar4 = *active;
  *state = *state & 2 | 4;
  local_58 = ZEXT416((uint)fVar11);
  local_68 = ZEXT416((uint)fVar10);
  r_00.y = local_98;
  r_00.x = local_48;
  r_00.h = fVar10;
  r_00.w = fVar11;
  local_d0 = str;
  fStack_94 = fStack_e4;
  fStack_90 = fStack_e4;
  fStack_8c = fStack_e4;
  fStack_44 = fStack_e4;
  iVar2 = nk_button_behavior(state,r_00,in,NK_BUTTON_DEFAULT);
  if (iVar2 != 0) {
    *state = 0x22;
    uVar4 = (uint)(uVar4 == 0);
  }
  fVar14 = local_f8 + fVar7;
  fVar10 = local_e8;
  if (local_e8 <= fVar13 + fVar12) {
    fVar10 = fVar13 + fVar12;
  }
  if ((((*state & 0x10) != 0) &&
      ((((uVar3 = 8, in == (nk_input *)0x0 || (fVar12 = (in->mouse).prev.x, fVar12 < local_48)) ||
        (local_48 + (float)local_58._0_4_ <= fVar12)) ||
       ((fVar12 = (in->mouse).prev.y, fVar12 < local_98 ||
        (local_98 + (float)local_68._0_4_ <= fVar12)))))) ||
     ((in != (nk_input *)0x0 &&
      (((fVar12 = (in->mouse).prev.x, local_48 <= fVar12 &&
        (fVar12 < local_48 + (float)local_58._0_4_)) &&
       ((fVar12 = (in->mouse).prev.y, local_98 <= fVar12 &&
        (uVar3 = 0x40, fVar12 < local_98 + (float)local_68._0_4_)))))))) {
    *state = *state | uVar3;
  }
  fVar9 = fVar8 + (float)local_b8._0_4_ + local_88;
  fVar12 = (float)local_78._0_4_ + (float)local_c8._0_4_ + local_88;
  local_f8 = (float)local_a8._0_4_ - (fVar8 + fVar8 + fVar7);
  fVar14 = (float)local_a8._0_4_ - fVar14;
  fVar10 = fVar10 - local_e8;
  *active = uVar4;
  fStack_ec = (float)local_a8._4_4_;
  fStack_f0 = (float)local_a8._4_4_;
  fVar8 = (float)local_c8._0_4_;
  fVar13 = (float)local_b8._0_4_;
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    fStack_f4 = (float)local_a8._4_4_;
    fStack_f0 = fStack_a0;
    fStack_ec = fStack_9c;
    local_78._0_4_ = fVar12;
    local_88 = (float)local_c8._0_4_;
    uStack_84 = local_c8._4_4_;
    fStack_80 = (float)local_b8._0_4_;
    uStack_7c = local_b8._4_4_;
    fStack_94 = (float)local_a8._4_4_;
    fStack_90 = fStack_a0;
    fStack_8c = fStack_9c;
    local_98 = fVar14;
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    fVar14 = local_98;
    fStack_ec = fStack_94;
    fStack_f0 = fStack_f4;
    fVar12 = (float)local_78._0_4_;
    fVar8 = local_88;
    fVar13 = fStack_80;
  }
  uVar1 = local_a8._0_4_;
  fStack_e0 = fStack_e4;
  uVar4 = *state;
  iVar2 = *active;
  fStack_f4 = fVar14;
  fStack_e4 = (float)local_c8._0_4_;
  uStack_dc = local_c8._4_4_;
  if (type == NK_TOGGLE_CHECK) {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_108.text = style->text_active;
        goto LAB_00121871;
      }
      pnVar5 = &style->cursor_normal;
      local_108.text = style->text_normal;
      pnVar6 = style;
    }
    else {
      local_108.text = style->text_hover;
LAB_00121871:
      pnVar6 = (nk_style_toggle *)&style->hover;
      pnVar5 = &style->cursor_hover;
    }
    if ((pnVar6->normal).type == NK_STYLE_ITEM_COLOR) {
      rect.y = fVar8;
      rect.x = fVar13;
      rect.h = (float)local_a8._0_4_;
      rect.w = (float)local_a8._0_4_;
      nk_fill_rect(out,rect,0.0,style->border_color);
      fVar14 = style->border;
      fVar13 = fVar14 + fVar14;
      fVar8 = fVar13;
      if (fVar13 <= (float)local_a8._0_4_) {
        fVar8 = (float)local_a8._0_4_;
      }
      rect_00.w = fVar8 - fVar13;
      rect_00.y = (float)local_c8._0_4_ + fVar14;
      rect_00.x = (float)local_b8._0_4_ + fVar14;
      rect_00.h = rect_00.w;
      nk_fill_rect(out,rect_00,0.0,(pnVar6->normal).data.color);
    }
    else {
      r_05.y = fVar8;
      r_05.x = fVar13;
      r_05.h = (float)local_a8._0_4_;
      r_05.w = (float)local_a8._0_4_;
      nk_draw_image(out,r_05,&(pnVar6->normal).data.image,(nk_color)0xffffffff);
    }
    rect_01.h = fStack_f4;
    rect_01.w = local_f8;
    if (iVar2 != 0) {
      img = (nk_image *)&pnVar5->data;
      if (pnVar5->type == NK_STYLE_ITEM_IMAGE) goto LAB_0012191b;
      rect_01.x = fVar9;
      rect_01.y = fVar12;
      nk_fill_rect(out,rect_01,0.0,*(nk_color *)img);
    }
  }
  else {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_108.text = style->text_active;
        goto LAB_001217a0;
      }
      pnVar5 = &style->cursor_normal;
      local_108.text = style->text_normal;
      pnVar6 = style;
    }
    else {
      local_108.text = style->text_hover;
LAB_001217a0:
      pnVar6 = (nk_style_toggle *)&style->hover;
      pnVar5 = &style->cursor_hover;
    }
    if ((pnVar6->normal).type == NK_STYLE_ITEM_COLOR) {
      r_02.y = fVar8;
      r_02.x = fVar13;
      r_02.h = (float)local_a8._0_4_;
      r_02.w = (float)local_a8._0_4_;
      nk_fill_circle(out,r_02,style->border_color);
      fVar14 = style->border;
      fVar13 = fVar14 + fVar14;
      fVar8 = fVar13;
      if (fVar13 <= (float)local_a8._0_4_) {
        fVar8 = (float)local_a8._0_4_;
      }
      r_03.w = fVar8 - fVar13;
      r_03.y = (float)local_c8._0_4_ + fVar14;
      r_03.x = (float)local_b8._0_4_ + fVar14;
      r_03.h = r_03.w;
      nk_fill_circle(out,r_03,(pnVar6->normal).data.color);
    }
    else {
      r_01.y = fVar8;
      r_01.x = fVar13;
      r_01.h = (float)local_a8._0_4_;
      r_01.w = (float)local_a8._0_4_;
      nk_draw_image(out,r_01,&(pnVar6->normal).data.image,(nk_color)0xffffffff);
    }
    r_04.h = fStack_f4;
    r_04.w = local_f8;
    if (iVar2 != 0) {
      img = (nk_image *)&pnVar5->data;
      if (pnVar5->type == NK_STYLE_ITEM_IMAGE) {
LAB_0012191b:
        r_06.h = fStack_f4;
        r_06.w = local_f8;
        r_06.x = fVar9;
        r_06.y = fVar12;
        nk_draw_image(out,r_06,img,(nk_color)0xffffffff);
      }
      else {
        r_04.x = fVar9;
        r_04.y = fVar12;
        nk_fill_circle(out,r_04,*(nk_color *)img);
      }
    }
  }
  local_108.padding.x = 0.0;
  local_108.padding.y = 0.0;
  local_108.background = style->text_background;
  b.y = fStack_e4;
  b.x = local_e8;
  b.h = (float)uVar1;
  b.w = fVar10;
  nk_widget_text(out,b,local_d0,len,&local_108,0x11,font);
  font = (nk_user_font *)style->draw_end;
  if (font != (nk_user_font *)0x0) {
    font = (nk_user_font *)(*(code *)font)(out,(style->userdata).ptr);
  }
LAB_00121993:
  return (int)font;
}

Assistant:

NK_LIB int
nk_do_toggle(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect r,
    int *active, const char *str, int len, enum nk_toggle_type type,
    const struct nk_style_toggle *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int was_active;
    struct nk_rect bounds;
    struct nk_rect select;
    struct nk_rect cursor;
    struct nk_rect label;

    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(font);
    if (!out || !style || !font || !active)
        return 0;

    r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
    r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

    /* add additional touch padding for touch screen devices */
    bounds.x = r.x - style->touch_padding.x;
    bounds.y = r.y - style->touch_padding.y;
    bounds.w = r.w + 2 * style->touch_padding.x;
    bounds.h = r.h + 2 * style->touch_padding.y;

    /* calculate the selector space */
    select.w = font->height;
    select.h = select.w;
    select.y = r.y + r.h/2.0f - select.h/2.0f;
    select.x = r.x;

    /* calculate the bounds of the cursor inside the selector */
    cursor.x = select.x + style->padding.x + style->border;
    cursor.y = select.y + style->padding.y + style->border;
    cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
    cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

    /* label behind the selector */
    label.x = select.x + select.w + style->spacing;
    label.y = select.y;
    label.w = NK_MAX(r.x + r.w, label.x) - label.x;
    label.h = select.w;

    /* update selector */
    was_active = *active;
    *active = nk_toggle_behavior(in, bounds, state, *active);

    /* draw selector */
    if (style->draw_begin)
        style->draw_begin(out, style->userdata);
    if (type == NK_TOGGLE_CHECK) {
        nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    } else {
        nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    }
    if (style->draw_end)
        style->draw_end(out, style->userdata);
    return (was_active != *active);
}